

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_json.c
# Opt level: O1

LY_ERR lydjson_create_opaq(lyd_json_ctx *lydctx,char *name,size_t name_len,char *prefix,
                          size_t prefix_len,lyd_node *parent,LYJSON_PARSER_STATUS *status_inner_p,
                          lyd_node **node_p)

{
  lyjson_ctx *jsonctx;
  size_t pref_len;
  LY_ERR LVar1;
  size_t sVar2;
  char *pcVar3;
  ly_bool dynamic;
  uint32_t type_hint;
  size_t module_name_len;
  char *module_name;
  char *local_58;
  size_t local_50;
  char *local_48;
  size_t local_40;
  size_t local_38;
  
  module_name_len = 0;
  dynamic = '\0';
  type_hint = 0;
  pcVar3 = (char *)0x0;
  sVar2 = 0;
  local_48 = name;
  local_40 = prefix_len;
  local_38 = name_len;
  if (*status_inner_p != LYJSON_OBJECT) {
    jsonctx = lydctx->jsonctx;
    pcVar3 = jsonctx->value;
    sVar2 = jsonctx->value_len;
    dynamic = jsonctx->dynamic;
    jsonctx->dynamic = '\0';
    LVar1 = lydjson_value_type_hint(jsonctx,status_inner_p,&type_hint);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
  }
  pref_len = local_40;
  local_58 = pcVar3;
  local_50 = sVar2;
  lydjson_get_node_prefix(parent,prefix,local_40,&module_name,&module_name_len);
  if ((parent == (lyd_node *)0x0 && module_name == (char *)0x0) &&
     (lydctx->any_schema != (lysc_node *)0x0)) {
    module_name = lydctx->any_schema->module->name;
    module_name_len = strlen(module_name);
  }
  pcVar3 = local_58;
  LVar1 = lyd_create_opaq(lydctx->jsonctx->ctx,local_48,local_38,prefix,pref_len,module_name,
                          module_name_len,local_58,local_50,&dynamic,LY_VALUE_JSON,(void *)0x0,
                          type_hint,node_p);
  if (dynamic != '\0') {
    free(pcVar3);
  }
  return LVar1;
}

Assistant:

static LY_ERR
lydjson_create_opaq(struct lyd_json_ctx *lydctx, const char *name, size_t name_len, const char *prefix, size_t prefix_len,
        struct lyd_node *parent, enum LYJSON_PARSER_STATUS *status_inner_p, struct lyd_node **node_p)
{
    LY_ERR ret = LY_SUCCESS;
    const char *value = NULL, *module_name;
    size_t value_len = 0, module_name_len = 0;
    ly_bool dynamic = 0;
    uint32_t type_hint = 0;

    if (*status_inner_p != LYJSON_OBJECT) {
        /* prepare for creating opaq node with a value */
        value = lydctx->jsonctx->value;
        value_len = lydctx->jsonctx->value_len;
        dynamic = lydctx->jsonctx->dynamic;
        lydctx->jsonctx->dynamic = 0;

        LY_CHECK_RET(lydjson_value_type_hint(lydctx->jsonctx, status_inner_p, &type_hint));
    }

    /* get the module name */
    lydjson_get_node_prefix(parent, prefix, prefix_len, &module_name, &module_name_len);
    if (!module_name && !parent && lydctx->any_schema) {
        /* in an anyxml/anydata tree, parsing first node, use the previous any schema node */
        module_name = lydctx->any_schema->module->name;
        module_name_len = strlen(module_name);
    }

    /* create node */
    ret = lyd_create_opaq(lydctx->jsonctx->ctx, name, name_len, prefix, prefix_len, module_name, module_name_len, value,
            value_len, &dynamic, LY_VALUE_JSON, NULL, type_hint, node_p);
    if (dynamic) {
        free((char *)value);
    }

    return ret;
}